

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool __thiscall wallet::WalletBatch::WriteLockedUTXO(WalletBatch *this,COutPoint *output)

{
  uint32_t uVar1;
  bool bVar2;
  long in_FS_OFFSET;
  uchar local_89;
  uchar local_88 [8];
  uchar auStack_80 [8];
  uchar local_78 [8];
  uchar auStack_70 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<transaction_identifier<false>,_unsigned_int>_>
  local_68;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = *(uchar (*) [8])(output->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  auStack_80 = *(uchar (*) [8])((output->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  local_78 = *(uchar (*) [8])((output->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10)
  ;
  auStack_70 = *(uchar (*) [8])
                ((output->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  uVar1 = output->n;
  std::__cxx11::string::string
            ((string *)&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             DBKeys::LOCKED_UTXO_abi_cxx11_);
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_78[0];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_78[1];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_78[2];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_78[3];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_78[4];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_78[5];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_78[6];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_78[7];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = auStack_70[0];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = auStack_70[1];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = auStack_70[2];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = auStack_70[3];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = auStack_70[4];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = auStack_70[5];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = auStack_70[6];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = auStack_70[7];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_88[0];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_88[1];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_88[2];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_88[3];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_88[4];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_88[5];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_88[6];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_88[7];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = auStack_80[0];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = auStack_80[1];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = auStack_80[2];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = auStack_80[3];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = auStack_80[4];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = auStack_80[5];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = auStack_80[6];
  local_68.second.first.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = auStack_80[7];
  local_89 = '1';
  local_68.second.second = uVar1;
  bVar2 = WriteIC<std::pair<std::__cxx11::string,std::pair<transaction_identifier<false>,unsigned_int>>,unsigned_char>
                    (this,&local_68,&local_89,true);
  std::__cxx11::string::~string((string *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteLockedUTXO(const COutPoint& output)
{
    return WriteIC(std::make_pair(DBKeys::LOCKED_UTXO, std::make_pair(output.hash, output.n)), uint8_t{'1'});
}